

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord3f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord3f *v)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::texcoord3f> local_7c;
  undefined1 local_6c [8];
  optional<tinyusdz::value::texcoord3f> pv_1;
  undefined1 local_48 [8];
  optional<tinyusdz::value::texcoord3f> pv;
  texcoord3f *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (texcoord3f *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002f8a67;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 4),t);
  bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 4));
  if (bVar2) {
    get_default_value<tinyusdz::value::texcoord3f>
              ((optional<tinyusdz::value::texcoord3f> *)((long)&pv_1.contained + 8),this);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::
    optional<tinyusdz::value::texcoord3f,_0>
              ((optional<tinyusdz::value::texcoord3f> *)local_48,
               (optional<tinyusdz::value::texcoord3f> *)((long)&pv_1.contained + 8));
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::~optional
              ((optional<tinyusdz::value::texcoord3f> *)((long)&pv_1.contained + 8));
    pv_1.contained._4_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
    if ((bool)pv_1.contained._4_1_) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::value
                         ((optional<tinyusdz::value::texcoord3f> *)local_48);
      fVar1 = pvVar3->t;
      v->s = pvVar3->s;
      v->t = fVar1;
      v->r = pvVar3->r;
      this_local._7_1_ = 1;
    }
    pv_1.contained._5_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::~optional
              ((optional<tinyusdz::value::texcoord3f> *)local_48);
    if (pv_1.contained._4_4_ != 0) goto LAB_002f8a67;
    bVar2 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_002f8a67;
    }
  }
  bVar2 = has_timesamples(this);
  if (bVar2) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord3f,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar2 = has_default(this);
    if (bVar2) {
      get_default_value<tinyusdz::value::texcoord3f>(&local_7c,this);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::
      optional<tinyusdz::value::texcoord3f,_0>
                ((optional<tinyusdz::value::texcoord3f> *)local_6c,&local_7c);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::~optional(&local_7c);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_6c);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::value
                           ((optional<tinyusdz::value::texcoord3f> *)local_6c);
        fVar1 = pvVar3->t;
        v->s = pvVar3->s;
        v->t = fVar1;
        v->r = pvVar3->r;
        this_local._7_1_ = 1;
      }
      pv_1.contained._5_3_ = 0;
      pv_1.contained._4_1_ = bVar2;
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::~optional
                ((optional<tinyusdz::value::texcoord3f> *)local_6c);
      if (pv_1.contained._4_4_ != 0) goto LAB_002f8a67;
    }
    this_local._7_1_ = 0;
  }
LAB_002f8a67:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }